

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall
MakefileGenerator::writeSubTargets
          (MakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> *targets,
          int flags)

{
  SubTarget *pSVar1;
  bool bVar2;
  undefined1 noBuild;
  bool bVar3;
  const_iterator o;
  long lVar4;
  qsizetype qVar5;
  QTextStream *pQVar6;
  const_reference ppSVar7;
  ulong uVar8;
  const_reference pQVar9;
  pointer pSVar10;
  iterator o_00;
  SubTarget **ppSVar11;
  const_iterator cVar12;
  QTextStream *pQVar13;
  uint in_ECX;
  QList<MakefileGenerator::SubTarget_*> *in_RDX;
  MakefileGenerator *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char> QVar14;
  SubTarget *subtarget_1;
  int target_4;
  int target_3;
  ProStringList *deplist;
  ProStringList *config_1;
  ProStringList *qut;
  ProStringList *config;
  SubTarget *subTarget;
  int target_2;
  int s_1;
  int suffix;
  SubTarget *subtarget;
  int target_1;
  bool dont_recurse;
  int target;
  ProStringList *qeui;
  ProKey rtkey;
  QString sub_targ;
  QString dep_2;
  QString dep_1;
  QString in_1;
  QString out_1;
  QString makefilein_1;
  QString out_directory_cdin_1;
  QString out_directory_1;
  QString in_directory_1;
  QStringList values;
  ProKey rkey;
  QSet<QString> recurse;
  QString dep;
  ConstIterator dep_it;
  QString deps;
  QString cmd;
  QString targ;
  ConstIterator qut_it;
  QString ofile;
  QString targetRule;
  QString suffix_1;
  Iterator it;
  QString s;
  ProStringList extraDeps;
  QString in;
  QString out;
  QString makefilein;
  QString out_directory_cdin;
  QString out_directory;
  QString in_directory;
  unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>
  sequentialInstallData;
  QString abs_source_path;
  QStringList targetSuffixes;
  ConstIterator qeui_it;
  SequentialInstallData *in_stack_ffffffffffffeb28;
  QMakeProject *in_stack_ffffffffffffeb30;
  QMakeProject *in_stack_ffffffffffffeb38;
  SequentialInstallData *in_stack_ffffffffffffeb40;
  QMakeEvaluator *in_stack_ffffffffffffeb48;
  MakefileGenerator *in_stack_ffffffffffffeb50;
  MakefileGenerator *in_stack_ffffffffffffeb58;
  const_iterator in_stack_ffffffffffffeb60;
  const_iterator in_stack_ffffffffffffeb68;
  MakefileGenerator *in_stack_ffffffffffffeb70;
  QString *in_stack_ffffffffffffeb78;
  QTextStream *in_stack_ffffffffffffeb80;
  MakefileGenerator *in_stack_ffffffffffffeb88;
  MakefileGenerator *in_stack_ffffffffffffebd0;
  QTextStream *in_stack_ffffffffffffebd8;
  MakefileGenerator *in_stack_ffffffffffffebe0;
  bool local_140a;
  byte local_13e1;
  undefined8 in_stack_ffffffffffffec30;
  MakefileGenerator *this_00;
  undefined1 noDummyQmakeAll;
  QTextStream *in_stack_ffffffffffffec38;
  MakefileGenerator *in_stack_ffffffffffffec40;
  bool local_1359;
  QTextStream *in_stack_ffffffffffffed08;
  MakefileGenerator *in_stack_ffffffffffffed10;
  int local_1280;
  int local_127c;
  int local_1230;
  int local_1224;
  int local_1218;
  int local_1204;
  undefined4 in_stack_ffffffffffffee00;
  uint uVar15;
  int in_stack_ffffffffffffee04;
  undefined1 local_1108 [24];
  undefined1 local_10f0 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_10d8;
  QStringBuilder<const_ProString_&,_const_char_(&)[16]> local_1050;
  undefined1 local_1040 [48];
  char16_t *local_1010;
  qsizetype local_1008;
  Data *local_1000;
  QStringBuilder<const_char_(&)[2],_const_QString_&> local_ff8;
  QStringBuilder<const_char_(&)[2],_const_ProString_&> local_fe8;
  QStringBuilder<const_char_(&)[2],_const_ProString_&> local_fc0;
  QFlagsStorage<MakefileGenerator::FileFixifyType> in_stack_fffffffffffff08c;
  undefined1 local_f68 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_f50;
  Data *local_f28;
  QString *local_f20;
  qsizetype local_f18;
  QStringBuilder<const_char_(&)[2],_const_QString_&> local_f10;
  QStringBuilder<QString_&,_const_char_(&)[2]> local_f00;
  qsizetype local_eb8;
  _List_node_base *local_eb0;
  _List_node_base *local_ea8;
  undefined1 local_ea0 [24];
  undefined1 local_e88 [32];
  QStringBuilder<QString_&,_QString_&> local_e68;
  undefined1 local_e40 [24];
  undefined1 local_e28 [24];
  QMakeHandler *local_e10;
  QMakeVfs *local_e08;
  Data *local_e00;
  QString local_df8;
  undefined1 local_de0 [56];
  undefined8 local_da8;
  undefined8 local_da0;
  undefined8 local_d98;
  undefined1 local_d90 [96];
  SequentialInstallData local_d30;
  undefined8 local_cc8;
  undefined8 local_cc0;
  undefined8 local_cb8;
  QString local_cb0 [2];
  undefined8 local_c80;
  undefined8 local_c78;
  undefined8 local_c70;
  QStringBuilder<const_ProString_&,_const_char_(&)[9]> local_c68;
  undefined1 local_c58 [48];
  undefined8 local_c28;
  undefined1 local_c20 [24];
  undefined1 local_c08 [31];
  undefined1 local_be9;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_bb0;
  undefined1 local_ba0 [48];
  undefined8 local_b70;
  undefined8 local_b68;
  undefined8 local_b60;
  const_iterator local_b58;
  QStringBuilder<const_ProString_&,_const_char_(&)[9]> local_b50;
  undefined8 local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  QStringBuilder<const_ProString_&,_const_char_(&)[10]> local_ae0;
  undefined1 local_ad0 [48];
  undefined8 local_aa0;
  undefined8 local_a98;
  undefined8 local_a90;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_a88;
  undefined1 local_a78 [48];
  undefined8 local_a48;
  undefined8 local_a40;
  undefined8 local_a38;
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_a30;
  const_iterator local_9f0 [22];
  undefined1 local_940 [24];
  undefined1 local_928 [56];
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined8 local_8e0;
  char *local_8d8;
  undefined1 local_858 [24];
  char *local_840;
  undefined1 local_808 [24];
  char *local_7f0;
  undefined1 local_7b8 [24];
  char *local_7a0;
  undefined1 local_768 [24];
  char *local_750;
  char *local_748;
  QStringBuilder<QString_&,_const_char_(&)[2]> local_740;
  undefined8 local_718;
  undefined8 local_710;
  undefined8 local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  QStringBuilder<QString_&,_const_char_(&)[8]> local_6e8;
  undefined1 local_6a8 [24];
  undefined8 local_690;
  undefined8 local_688;
  undefined8 local_680;
  iterator local_678;
  QStringBuilder<QString_&,_const_char_(&)[2]> local_670;
  undefined1 local_648 [152];
  undefined1 local_5b0 [24];
  QStringBuilder<QString_&,_const_char_(&)[2]> local_598;
  undefined1 local_570 [88];
  QString *local_518;
  char local_510;
  undefined1 local_501;
  Data *local_500;
  char *local_4c8;
  char *local_4c0;
  QString *local_4b8;
  qsizetype local_4b0;
  QExplicitlySharedDataPointer<QMakeFeatureRoots> local_4a8;
  Data *local_4a0;
  undefined1 local_498 [24];
  undefined1 local_480 [24];
  QHash<ProKey,_ProFunctionDef> local_468;
  Data *local_460;
  ProString *local_458;
  QStringBuilder<QString_&,_const_char_(&)[11]> local_450;
  undefined1 local_440 [24];
  undefined1 local_428 [24];
  undefined1 local_410 [96];
  undefined1 local_3b0 [24];
  undefined1 local_398 [24];
  undefined1 local_380 [32];
  QStringBuilder<QString_&,_QString_&> local_360;
  undefined1 local_338 [24];
  undefined1 local_320 [24];
  char16_t *local_308;
  qsizetype local_300;
  Data *local_2f8;
  QString local_2f0;
  undefined1 local_2d8 [56];
  undefined1 local_2a0 [120];
  SequentialInstallData local_228;
  Data *local_1c0;
  char16_t *local_1b8;
  qsizetype local_1b0;
  QString local_1a8 [2];
  Data *local_178;
  QString local_80;
  QList<QString> local_68;
  const_iterator local_50 [7];
  QString *local_18;
  char local_10;
  QMakeParser *local_8;
  
  local_8 = *(QMakeParser **)(in_FS_OFFSET + 0x28);
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
  QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
  ProKey::~ProKey((ProKey *)0x19aeb2);
  local_50[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
  local_50[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffeb30);
  while( true ) {
    o = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffeb30);
    bVar2 = QList<ProString>::const_iterator::operator!=(local_50,o);
    if (!bVar2) break;
    QTextStream::operator<<((QTextStream *)in_RSI,"include ");
    QList<ProString>::const_iterator::operator*(local_50);
    ::operator<<((QTextStream *)in_stack_ffffffffffffeb60.i,(ProString *)in_stack_ffffffffffffeb58);
    ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                 (QTextStreamFunction)in_stack_ffffffffffffeb28);
    QList<ProString>::const_iterator::operator++(local_50);
  }
  if ((in_ECX & 4) == 0) {
    (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI);
    QTextStream::operator<<((QTextStream *)in_RSI,"SUBTARGETS    = ");
    for (in_stack_ffffffffffffee04 = 0; lVar4 = (long)in_stack_ffffffffffffee04,
        qVar5 = QList<MakefileGenerator::SubTarget_*>::size(in_RDX), lVar4 < qVar5;
        in_stack_ffffffffffffee04 = in_stack_ffffffffffffee04 + 1) {
      pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," \\\n\t\t");
      ppSVar7 = QList<MakefileGenerator::SubTarget_*>::at
                          ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                           (qsizetype)in_stack_ffffffffffffeb28);
      QTextStream::operator<<(pQVar6,(QString *)&(*ppSVar7)->target);
    }
    ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                 (QTextStreamFunction)in_stack_ffffffffffffeb28);
    ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                 (QTextStreamFunction)in_stack_ffffffffffffeb28);
  }
  writeExtraVariables(in_stack_ffffffffffffeb70,(QTextStream *)in_stack_ffffffffffffeb68.i);
  local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.d.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  local_68.d.size = -0x5555555555555556;
  QList<QString>::QList((QList<QString> *)0x19b0b2);
  local_80.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_80.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_80.d.size = -0x5555555555555556;
  ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
  QMakeEvaluator::first(in_stack_ffffffffffffeb48,(ProKey *)in_stack_ffffffffffffeb40);
  ProString::toQString((ProString *)in_stack_ffffffffffffeb28);
  ProString::~ProString((ProString *)0x19b149);
  ProKey::~ProKey((ProKey *)0x19b156);
  if ((in_ECX & 8) == 0) {
    QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    in_stack_ffffffffffffed08 =
         (QTextStream *)
         QList<QString>::operator<<
                   ((QList<QString> *)in_stack_ffffffffffffeb30,
                    &in_stack_ffffffffffffeb28->targetPrefix);
    QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    in_stack_ffffffffffffed10 =
         (MakefileGenerator *)
         QList<QString>::operator<<
                   ((QList<QString> *)in_stack_ffffffffffffeb30,
                    &in_stack_ffffffffffffeb28->targetPrefix);
    QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix)
    ;
    QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix)
    ;
    QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix)
    ;
    QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    QList<QString>::operator<<
              ((QList<QString> *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix)
    ;
    QString::~QString((QString *)0x19b2c4);
    QString::~QString((QString *)0x19b2d1);
    QString::~QString((QString *)0x19b2de);
    QString::~QString((QString *)0x19b2eb);
    QString::~QString((QString *)0x19b2f8);
    QString::~QString((QString *)0x19b305);
  }
  local_178 = (Data *)0xaaaaaaaaaaaaaaaa;
  std::
  unique_ptr<MakefileGenerator::writeSubTargets(QTextStream&,QList<MakefileGenerator::SubTarget*>,int)::SequentialInstallData,std::default_delete<MakefileGenerator::writeSubTargets(QTextStream&,QList<MakefileGenerator::SubTarget*>,int)::SequentialInstallData>>
  ::
  unique_ptr<std::default_delete<MakefileGenerator::writeSubTargets(QTextStream&,QList<MakefileGenerator::SubTarget*>,int)::SequentialInstallData>,void>
            ((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_> *)
             in_stack_ffffffffffffeb30);
  QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
  noBuild = QMakeProject::isActiveConfig
                      (in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30,
                       SUB81((ulong)in_stack_ffffffffffffeb28 >> 0x38,0));
  QString::~QString((QString *)0x19b377);
  uVar15 = CONCAT13(noBuild,(int3)in_stack_ffffffffffffee00) & 0x1ffffff;
  local_1204 = 0;
  while( true ) {
    qVar5 = QList<MakefileGenerator::SubTarget_*>::size(in_RDX);
    noDummyQmakeAll = (undefined1)((ulong)in_stack_ffffffffffffec30 >> 0x38);
    if (qVar5 <= local_1204) break;
    ppSVar7 = QList<MakefileGenerator::SubTarget_*>::at
                        ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                         (qsizetype)in_stack_ffffffffffffeb28);
    pSVar1 = *ppSVar7;
    local_1a8[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1a8[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_1a8[0].d.size = -0x5555555555555556;
    QString::QString((QString *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix);
    bVar2 = QString::isEmpty((QString *)0x19b436);
    if ((!bVar2) && (uVar8 = QString::endsWith((QString *)local_1a8,0x3bdbd8), (uVar8 & 1) == 0)) {
      QString::operator+=((QString *)in_stack_ffffffffffffeb30,
                          &in_stack_ffffffffffffeb28->targetPrefix);
    }
    local_1c0 = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1b8 = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_1b0 = -0x5555555555555556;
    QString::QString((QString *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix);
    bVar2 = QString::isEmpty((QString *)0x19b4be);
    if ((!bVar2) && (uVar8 = QString::endsWith((QString *)&local_1c0,0x3bdbd8), (uVar8 & 1) == 0)) {
      QString::operator+=((QString *)in_stack_ffffffffffffeb30,
                          &in_stack_ffffffffffffeb28->targetPrefix);
    }
    bVar2 = QString::isEmpty((QString *)0x19b500);
    if ((!bVar2) &&
       (uVar8 = QString::startsWith((QString *)&local_1c0,(CaseSensitivity)&local_80),
       (uVar8 & 1) != 0)) {
      QString::size(&local_80);
      QString::mid((longlong)&local_228.commands,(longlong)&local_1c0);
      ::operator+((QString *)in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QString> *)in_stack_ffffffffffffeb28);
      QString::operator=((QString *)in_stack_ffffffffffffeb30,
                         &in_stack_ffffffffffffeb28->targetPrefix);
      QString::~QString((QString *)0x19b5aa);
      QStringBuilder<QString_&,_QString>::~QStringBuilder
                ((QStringBuilder<QString_&,_QString> *)0x19b5b7);
      QString::~QString((QString *)0x19b5c4);
    }
    local_228.targetPrefix.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_228.targetPrefix.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_228.targetPrefix.d.size = -0x5555555555555556;
    bVar2 = QString::isEmpty((QString *)0x19b5fe);
    if (bVar2) {
      QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
    }
    else {
      (**(code **)(*in_RDI + 0x60))(local_2a0 + 0x18,in_RDI,&local_1c0);
      ::operator+((char (*) [6])in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30);
      ::operator+((QStringBuilder<const_char_(&)[6],_QString> *)in_stack_ffffffffffffeb38,
                  (char (*) [5])in_stack_ffffffffffffeb30);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]> *)
                 in_stack_ffffffffffffeb28);
      QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]> *)
                 0x19b6d1);
      QStringBuilder<const_char_(&)[6],_QString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[6],_QString> *)0x19b6ea);
      QString::~QString((QString *)0x19b703);
    }
    local_2a0._0_8_ = (QMakeEvaluator *)0xaaaaaaaaaaaaaaaa;
    local_2a0._8_8_ = -0x5555555555555556;
    local_2a0._16_8_ = (ProFile *)0xaaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x60))(local_2d8,in_RDI,&pSVar1->makefile);
    ::operator+((char (*) [5])in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<const_char_(&)[5],_QString> *)in_stack_ffffffffffffeb28);
    QStringBuilder<const_char_(&)[5],_QString>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[5],_QString> *)0x19b790);
    QString::~QString((QString *)0x19b79d);
    local_2f0.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_2f0.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_2f0.d.size = -0x5555555555555556;
    QString::QString((QString *)0x19b7d7);
    local_308 = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_300 = -0x5555555555555556;
    local_2f8 = (Data *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)0x19b811);
    bVar2 = QString::isEmpty((QString *)0x19b822);
    if (!bVar2) {
      QString::operator=(&local_2f0,(QString *)&pSVar1->makefile);
      local_360 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                              &in_stack_ffffffffffffeb28->targetPrefix);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QString_&> *)in_stack_ffffffffffffeb28);
      QFlags<MakefileGenerator::FileFixifyType>::QFlags
                ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffeb30,
                 (FileFixifyType)((ulong)in_stack_ffffffffffffeb28 >> 0x20));
      fileFixify(in_stack_ffffffffffffebe0,(QString *)in_stack_ffffffffffffebd8,
                 (FileFixifyTypes)in_stack_fffffffffffff08c.i,
                 SUB81((ulong)in_stack_ffffffffffffebd0 >> 0x38,0));
      (**(code **)(*in_RDI + 0x60))(local_320,in_RDI,local_338);
      QString::operator=((QString *)in_stack_ffffffffffffeb30,
                         &in_stack_ffffffffffffeb28->targetPrefix);
      QString::~QString((QString *)0x19b8fd);
      QString::~QString((QString *)0x19b90a);
      QString::~QString((QString *)0x19b917);
      uVar8 = QString::startsWith((QString *)&local_2f0,(CaseSensitivity)local_1a8);
      if ((uVar8 & 1) != 0) {
        QString::size(local_1a8);
        QString::mid((longlong)local_380,(longlong)&local_2f0);
        QString::operator=((QString *)in_stack_ffffffffffffeb30,
                           &in_stack_ffffffffffffeb28->targetPrefix);
        QString::~QString((QString *)0x19b985);
      }
      (**(code **)(*in_RDI + 0x60))(local_398,in_RDI,&local_2f0);
      QString::operator=((QString *)in_stack_ffffffffffffeb30,
                         &in_stack_ffffffffffffeb28->targetPrefix);
      QString::~QString((QString *)0x19b9c5);
      pQVar6 = (QTextStream *)
               QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&pSVar1->target);
      QTextStream::operator<<(pQVar6,"-qmake_all: ");
      if ((in_ECX & 2) == 0) {
        bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x19ba6c);
        if (!bVar2) {
          QString::QString((QString *)0x19baa7);
          QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i)
          ;
          QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i)
          ;
          valGlue((MakefileGenerator *)in_stack_ffffffffffffeb60.i,
                  (ProStringList *)in_stack_ffffffffffffeb58,(QString *)in_stack_ffffffffffffeb50,
                  (QString *)in_stack_ffffffffffffeb48,&in_stack_ffffffffffffeb40->targetPrefix);
          QTextStream::operator<<((QTextStream *)in_RSI,(QString *)local_3b0);
          QString::~QString((QString *)0x19bb26);
          QString::~QString((QString *)0x19bb33);
          QString::~QString((QString *)0x19bb40);
          QString::~QString((QString *)0x19bb4d);
        }
      }
      else if (local_1204 != 0) {
        ppSVar7 = QList<MakefileGenerator::SubTarget_*>::at
                            ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                             (qsizetype)in_stack_ffffffffffffeb28);
        pQVar6 = (QTextStream *)
                 QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&(*ppSVar7)->target);
        QTextStream::operator<<(pQVar6,"-qmake_all");
      }
      QTextStream::operator<<((QTextStream *)in_RSI," FORCE\n\t");
      bVar2 = QString::isEmpty((QString *)0x19bb70);
      if (!bVar2) {
        mkdir_p_asstring(in_stack_ffffffffffffeb50,(QString *)in_stack_ffffffffffffeb48,
                         SUB81((ulong)in_stack_ffffffffffffeb40 >> 0x38,0));
        pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,(QString *)local_410);
        QTextStream::operator<<(pQVar6,(QString *)(local_2a0 + 0x78));
        QString::~QString((QString *)0x19bbd8);
      }
      pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,"$(QMAKE) -o ");
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_2f0);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,' ');
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_308);
      buildArgs((MakefileGenerator *)in_stack_ffffffffffffeb60.i,
                SUB81((ulong)in_stack_ffffffffffffeb58 >> 0x38,0));
      QTextStream::operator<<(pQVar6,(QString *)local_428);
      QString::~QString((QString *)0x19bc5a);
      if ((uVar15 & 0x1000000) == 0) {
        local_450 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                (char (*) [11])in_stack_ffffffffffffeb28);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QString_&,_const_char_(&)[11]> *)in_stack_ffffffffffffeb28);
        (**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI,local_2a0 + 0x78,local_440);
        QString::~QString((QString *)0x19bce0);
      }
      else {
        ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                     (QTextStreamFunction)in_stack_ffffffffffffeb28);
      }
    }
    pQVar6 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&pSVar1->target);
    QTextStream::operator<<(pQVar6,":");
    local_468.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_460 = (Data *)0xaaaaaaaaaaaaaaaa;
    local_458 = (ProString *)0xaaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x50))(&local_468);
    bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x19bd70);
    if (!bVar2) {
      pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
      valList((MakefileGenerator *)in_stack_ffffffffffffeb68.i,
              (ProStringList *)in_stack_ffffffffffffeb60.i);
      QTextStream::operator<<(pQVar6,(QString *)local_480);
      QString::~QString((QString *)0x19bdcf);
    }
    bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x19bde3);
    if (!bVar2) {
      pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
      valList((MakefileGenerator *)in_stack_ffffffffffffeb68.i,
              (ProStringList *)in_stack_ffffffffffffeb60.i);
      QTextStream::operator<<(pQVar6,(QString *)local_498);
      QString::~QString((QString *)0x19be49);
    }
    QTextStream::operator<<((QTextStream *)in_RSI," FORCE");
    in_stack_ffffffffffffeb28 = (SequentialInstallData *)(local_2a0 + 0x78);
    in_stack_ffffffffffffeb30 = (QMakeProject *)local_2a0;
    writeSubTargetCall(in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78
                       ,(QString *)in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68.i,
                       in_stack_ffffffffffffeb60.i,
                       (QString *)CONCAT44(in_stack_ffffffffffffee04,uVar15),&(o.i)->m_string);
    ProStringList::~ProStringList((ProStringList *)0x19beb8);
    for (local_1218 = 0; qVar5 = QList<QString>::size(&local_68), local_1218 < qVar5;
        local_1218 = local_1218 + 1) {
      local_4b0 = -0x5555555555555556;
      local_4a8.d.ptr =
           (totally_ordered_wrapper<QMakeFeatureRoots_*>)(QMakeFeatureRoots *)0xaaaaaaaaaaaaaaaa;
      local_4a0 = (Data *)0xaaaaaaaaaaaaaaaa;
      QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                         (qsizetype)in_stack_ffffffffffffeb28);
      QString::QString((QString *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix
                      );
      local_4b8 = (QString *)0x340cdb;
      bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28);
      if (bVar2) {
        QString::operator=((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb58);
      }
      else {
        local_4c0 = "uninstall_subtargets";
        bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28
                            );
        if (bVar2) {
          QString::operator=((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb58)
          ;
        }
        else {
          local_4c8 = "make_first";
          bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,
                               (char **)in_stack_ffffffffffffeb28);
          if (bVar2) {
            QString::QString((QString *)0x19c000);
            QString::operator=((QString *)in_stack_ffffffffffffeb30,
                               &in_stack_ffffffffffffeb28->targetPrefix);
            QString::~QString((QString *)0x19c022);
          }
        }
      }
      QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
      bVar2 = QMakeProject::isActiveConfig
                        (in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30,
                         SUB81((ulong)in_stack_ffffffffffffeb28 >> 0x38,0));
      local_1359 = false;
      if (bVar2) {
        local_500 = (Data *)0x352a41;
        local_1359 = ::operator==((QString *)in_stack_ffffffffffffeb30,
                                  (char **)in_stack_ffffffffffffeb28);
      }
      QString::~QString((QString *)0x19c0c0);
      if (local_1359 != false) {
        bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>
                            *)0x19c0dd);
        if (!bVar2) {
          operator_new(0x40);
          writeSubTargets::SequentialInstallData::SequentialInstallData(in_stack_ffffffffffffeb40);
          std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::reset
                    ((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>
                      *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28);
        }
        local_501 = 0x2d;
        QVar14 = ::operator+((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30)
        ;
        local_518 = QVar14.a;
        local_510 = QVar14.b;
        local_18 = local_518;
        local_10 = local_510;
        std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::
        operator->((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_> *
                   )0x19c16b);
        ::operator+=(in_stack_ffffffffffffeb60.i,
                     (QStringBuilder<QString_&,_char> *)in_stack_ffffffffffffeb58);
        std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::
        operator->((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_> *
                   )0x19c188);
        local_570._24_16_ =
             (undefined1  [16])
             ::operator+((QString *)in_stack_ffffffffffffeb30,
                         (char (*) [2])in_stack_ffffffffffffeb28);
        ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffeb30,
                    &in_stack_ffffffffffffeb28->targetPrefix);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                   in_stack_ffffffffffffeb28);
        in_stack_ffffffffffffeb28 = (SequentialInstallData *)(local_2a0 + 0x78);
        in_stack_ffffffffffffeb30 = (QMakeProject *)(local_570 + 0x40);
        writeSubTargetCall(in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,
                           in_stack_ffffffffffffeb78,(QString *)in_stack_ffffffffffffeb70,
                           in_stack_ffffffffffffeb68.i,in_stack_ffffffffffffeb60.i,
                           (QString *)CONCAT44(in_stack_ffffffffffffee04,uVar15),&(o.i)->m_string);
        QString::~QString((QString *)0x19c245);
        std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::
        operator->((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_> *
                   )0x19c252);
        chopEndLines((QString *)in_stack_ffffffffffffeb30);
      }
      if ((in_ECX & 2) != 0) {
        pQVar6 = (QTextStream *)
                 QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&pSVar1->target);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"-");
        pQVar9 = QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                                    (qsizetype)in_stack_ffffffffffffeb28);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)pQVar9);
        QTextStream::operator<<(pQVar6,"-ordered:");
        if (local_1204 != 0) {
          pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
          ppSVar7 = QList<MakefileGenerator::SubTarget_*>::at
                              ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                               (qsizetype)in_stack_ffffffffffffeb28);
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&(*ppSVar7)->target);
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"-");
          pQVar9 = QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                                      (qsizetype)in_stack_ffffffffffffeb28);
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)pQVar9);
          QTextStream::operator<<(pQVar6,"-ordered ");
        }
        QTextStream::operator<<((QTextStream *)in_RSI," FORCE");
        local_598 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                (char (*) [2])in_stack_ffffffffffffeb28);
        ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffeb30,
                    &in_stack_ffffffffffffeb28->targetPrefix);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                   in_stack_ffffffffffffeb28);
        in_stack_ffffffffffffeb28 = (SequentialInstallData *)(local_2a0 + 0x78);
        in_stack_ffffffffffffeb30 = (QMakeProject *)local_570;
        writeSubTargetCall(in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,
                           in_stack_ffffffffffffeb78,(QString *)in_stack_ffffffffffffeb70,
                           in_stack_ffffffffffffeb68.i,in_stack_ffffffffffffeb60.i,
                           (QString *)CONCAT44(in_stack_ffffffffffffee04,uVar15),&(o.i)->m_string);
        QString::~QString((QString *)0x19c44d);
      }
      pQVar6 = (QTextStream *)
               QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&pSVar1->target);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"-");
      pQVar9 = QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                                  (qsizetype)in_stack_ffffffffffffeb28);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)pQVar9);
      QTextStream::operator<<(pQVar6,":");
      bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x19c4c5);
      if (!bVar2) {
        pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
        QString::QString((QString *)0x19c50c);
        QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                           (qsizetype)in_stack_ffffffffffffeb28);
        local_648._64_16_ =
             (undefined1  [16])
             ::operator+((char (*) [2])in_stack_ffffffffffffeb30,
                         &in_stack_ffffffffffffeb28->targetPrefix);
        ::operator+((QStringBuilder<const_char_(&)[2],_const_QString_&> *)in_stack_ffffffffffffeb30,
                    (char (*) [2])in_stack_ffffffffffffeb28);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<QStringBuilder<const_char_(&)[2],_const_QString_&>,_const_char_(&)[2]>
                    *)in_stack_ffffffffffffeb28);
        QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                           (qsizetype)in_stack_ffffffffffffeb28);
        local_648._24_16_ =
             (undefined1  [16])
             ::operator+((char (*) [2])in_stack_ffffffffffffeb30,
                         &in_stack_ffffffffffffeb28->targetPrefix);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_char_(&)[2],_const_QString_&> *)in_stack_ffffffffffffeb28);
        valGlue((MakefileGenerator *)in_stack_ffffffffffffeb60.i,
                (ProStringList *)in_stack_ffffffffffffeb58,(QString *)in_stack_ffffffffffffeb50,
                (QString *)in_stack_ffffffffffffeb48,&in_stack_ffffffffffffeb40->targetPrefix);
        QTextStream::operator<<(pQVar6,(QString *)local_5b0);
        QString::~QString((QString *)0x19c611);
        QString::~QString((QString *)0x19c61e);
        QString::~QString((QString *)0x19c62b);
        QString::~QString((QString *)0x19c638);
      }
      QTextStream::operator<<((QTextStream *)in_RSI," FORCE");
      in_stack_ffffffffffffec40 = in_RSI;
      local_670 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                              (char (*) [2])in_stack_ffffffffffffeb28);
      ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffeb30,
                  &in_stack_ffffffffffffeb28->targetPrefix);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                 in_stack_ffffffffffffeb28);
      in_stack_ffffffffffffeb28 = (SequentialInstallData *)(local_2a0 + 0x78);
      in_stack_ffffffffffffeb30 = (QMakeProject *)local_648;
      writeSubTargetCall(in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80,
                         in_stack_ffffffffffffeb78,(QString *)in_stack_ffffffffffffeb70,
                         in_stack_ffffffffffffeb68.i,in_stack_ffffffffffffeb60.i,
                         (QString *)CONCAT44(in_stack_ffffffffffffee04,uVar15),&(o.i)->m_string);
      QString::~QString((QString *)0x19c70d);
      QString::~QString((QString *)0x19c71a);
    }
    QString::~QString((QString *)0x19c73d);
    QString::~QString((QString *)0x19c74a);
    QString::~QString((QString *)0x19c757);
    QString::~QString((QString *)0x19c764);
    QString::~QString((QString *)0x19c771);
    QString::~QString((QString *)0x19c77e);
    local_1204 = local_1204 + 1;
  }
  ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
               (QTextStreamFunction)in_stack_ffffffffffffeb28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>
                      *)0x19c7b5);
  if (bVar2) {
    this_00 = in_RSI;
    pSVar10 = std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::
              operator->((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>
                          *)0x19c7db);
    pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)this_00,(QString *)pSVar10);
    noDummyQmakeAll = (undefined1)((ulong)this_00 >> 0x38);
    in_stack_ffffffffffffec38 = (QTextStream *)QTextStream::operator<<(pQVar6,"install: FORCE");
    pSVar10 = std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::
              operator->((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>
                          *)0x19c80f);
    QTextStream::operator<<(in_stack_ffffffffffffec38,(QString *)&pSVar10->commands);
    ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                 (QTextStreamFunction)in_stack_ffffffffffffeb28);
    ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                 (QTextStreamFunction)in_stack_ffffffffffffeb28);
  }
  if ((in_ECX & 8) == 0) {
    writeMakeQmake(in_stack_ffffffffffffec40,in_stack_ffffffffffffec38,(bool)noDummyQmakeAll);
    QTextStream::operator<<((QTextStream *)in_RSI,"qmake_all:");
    bVar2 = QList<MakefileGenerator::SubTarget_*>::isEmpty
                      ((QList<MakefileGenerator::SubTarget_*> *)0x19c88f);
    if (!bVar2) {
      local_678.i = (SubTarget **)0xaaaaaaaaaaaaaaaa;
      local_678 = QList<MakefileGenerator::SubTarget_*>::begin
                            ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30);
      while( true ) {
        o_00 = QList<MakefileGenerator::SubTarget_*>::end
                         ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30);
        bVar2 = QList<MakefileGenerator::SubTarget_*>::iterator::operator!=(&local_678,o_00);
        if (!bVar2) break;
        QList<MakefileGenerator::SubTarget_*>::iterator::operator*(&local_678);
        bVar2 = QString::isEmpty((QString *)0x19c904);
        if (!bVar2) {
          pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
          ppSVar11 = QList<MakefileGenerator::SubTarget_*>::iterator::operator*(&local_678);
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&(*ppSVar11)->target);
          QTextStream::operator<<(pQVar6,"-qmake_all");
        }
        QList<MakefileGenerator::SubTarget_*>::iterator::operator++(&local_678);
      }
    }
    QTextStream::operator<<((QTextStream *)in_RSI," FORCE\n\n");
  }
  local_1224 = 0;
  do {
    qVar5 = QList<QString>::size(&local_68);
    if (qVar5 <= local_1224) {
      ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
      QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
      ProKey::~ProKey((ProKey *)0x19d3f7);
      local_9f0[0].i = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_9f0[0] = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffeb30);
      while( true ) {
        cVar12 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffeb30);
        bVar2 = QList<ProString>::const_iterator::operator!=(local_9f0,cVar12);
        if (!bVar2) break;
        QList<ProString>::const_iterator::operator*(local_9f0);
        local_a30 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                (char (*) [8])in_stack_ffffffffffffeb28);
        ProKey::ProKey<ProString_const&,char_const(&)[8]>
                  ((ProKey *)in_stack_ffffffffffffeb30,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)in_stack_ffffffffffffeb28
                  );
        QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
        ProKey::~ProKey((ProKey *)0x19d4ec);
        local_a48 = 0xaaaaaaaaaaaaaaaa;
        local_a40 = 0xaaaaaaaaaaaaaaaa;
        local_a38 = 0xaaaaaaaaaaaaaaaa;
        QList<ProString>::const_iterator::operator*(local_9f0);
        local_a88 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                (char (*) [8])in_stack_ffffffffffffeb28);
        ProKey::ProKey<ProString_const&,char_const(&)[8]>
                  ((ProKey *)in_stack_ffffffffffffeb30,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)in_stack_ffffffffffffeb28
                  );
        (**(code **)(*in_RDI + 0xb0))(&local_a48,in_RDI,local_a78);
        ProKey::~ProKey((ProKey *)0x19d598);
        local_aa0 = 0xaaaaaaaaaaaaaaaa;
        local_a98 = 0xaaaaaaaaaaaaaaaa;
        local_a90 = 0xaaaaaaaaaaaaaaaa;
        QList<ProString>::const_iterator::operator*(local_9f0);
        local_ae0 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                (char (*) [10])in_stack_ffffffffffffeb28);
        ProKey::ProKey<ProString_const&,char_const(&)[10]>
                  ((ProKey *)in_stack_ffffffffffffeb30,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[10]> *)
                   in_stack_ffffffffffffeb28);
        (**(code **)(*in_RDI + 0xb0))(&local_aa0,in_RDI,local_ad0);
        ProKey::~ProKey((ProKey *)0x19d634);
        local_af8 = 0xaaaaaaaaaaaaaaaa;
        local_af0 = 0xaaaaaaaaaaaaaaaa;
        local_ae8 = 0xaaaaaaaaaaaaaaaa;
        QString::QString((QString *)0x19d66e);
        bVar2 = QString::isEmpty((QString *)0x19d67b);
        if (bVar2) {
          QList<ProString>::const_iterator::operator*(local_9f0);
          ProString::toQString((ProString *)in_stack_ffffffffffffeb28);
          QString::operator=((QString *)in_stack_ffffffffffffeb30,
                             &in_stack_ffffffffffffeb28->targetPrefix);
          QString::~QString((QString *)0x19d6c0);
        }
        ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                     (QTextStreamFunction)in_stack_ffffffffffffeb28);
        QList<ProString>::const_iterator::operator*(local_9f0);
        local_b50 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                (char (*) [9])in_stack_ffffffffffffeb28);
        ProKey::ProKey<ProString_const&,char_const(&)[9]>
                  ((ProKey *)in_stack_ffffffffffffeb30,
                   (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)in_stack_ffffffffffffeb28
                  );
        QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
        ProKey::~ProKey((ProKey *)0x19d75f);
        local_b58.i = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_b58 = QList<ProString>::begin((QList<ProString> *)in_stack_ffffffffffffeb30);
        while( true ) {
          cVar12 = QList<ProString>::end((QList<ProString> *)in_stack_ffffffffffffeb30);
          bVar2 = QList<ProString>::const_iterator::operator!=(&local_b58,cVar12);
          if (!bVar2) break;
          local_b70 = 0xaaaaaaaaaaaaaaaa;
          local_b68 = 0xaaaaaaaaaaaaaaaa;
          local_b60 = 0xaaaaaaaaaaaaaaaa;
          QList<ProString>::const_iterator::operator*(&local_b58);
          local_bb0 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                  (char (*) [8])in_stack_ffffffffffffeb28);
          ProKey::ProKey<ProString_const&,char_const(&)[8]>
                    ((ProKey *)in_stack_ffffffffffffeb30,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)
                     in_stack_ffffffffffffeb28);
          (**(code **)(*in_RDI + 0xb0))(&local_b70,in_RDI,local_ba0);
          ProKey::~ProKey((ProKey *)0x19d85f);
          bVar2 = QString::isEmpty((QString *)0x19d86c);
          if (bVar2) {
            QList<ProString>::const_iterator::operator*(&local_b58);
            ProString::toQString((ProString *)in_stack_ffffffffffffeb28);
            QString::operator=((QString *)in_stack_ffffffffffffeb30,
                               &in_stack_ffffffffffffeb28->targetPrefix);
            QString::~QString((QString *)0x19d8b1);
          }
          local_be9 = 0x20;
          Option::fixPathToTargetOS
                    ((QString *)in_stack_ffffffffffffeb48,
                     SUB81((ulong)in_stack_ffffffffffffeb40 >> 0x38,0),
                     SUB81((ulong)in_stack_ffffffffffffeb40 >> 0x30,0));
          (**(code **)(*in_RDI + 0x68))(local_c08,in_RDI,local_c20);
          ::operator+((char *)in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30);
          ::operator+=(in_stack_ffffffffffffeb60.i,
                       (QStringBuilder<char,_QString> *)in_stack_ffffffffffffeb58);
          QStringBuilder<char,_QString>::~QStringBuilder((QStringBuilder<char,_QString> *)0x19d932);
          QString::~QString((QString *)0x19d93f);
          QString::~QString((QString *)0x19d94c);
          QString::~QString((QString *)0x19d959);
          QList<ProString>::const_iterator::operator++(&local_b58);
        }
        qVar5 = QListSpecialMethodsBase<ProString>::indexOf<char[10]>
                          ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffeb30,
                           (char (*) [10])in_stack_ffffffffffffeb28,0x19d983);
        if (qVar5 != -1) {
          local_c28 = 0xaaaaaaaaaaaaaaaa;
          QSet<QString>::QSet((QSet<QString> *)0x19d9a9);
          memset(local_c58,0xaa,0x30);
          QList<ProString>::const_iterator::operator*(local_9f0);
          local_c68 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                  (char (*) [9])in_stack_ffffffffffffeb28);
          ProKey::ProKey<ProString_const&,char_const(&)[9]>
                    ((ProKey *)in_stack_ffffffffffffeb30,
                     (QStringBuilder<const_ProString_&,_const_char_(&)[9]> *)
                     in_stack_ffffffffffffeb28);
          bVar2 = QMakeProject::isSet(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28)
          ;
          if (bVar2) {
            local_c80 = 0xaaaaaaaaaaaaaaaa;
            local_c78 = 0xaaaaaaaaaaaaaaaa;
            local_c70 = 0xaaaaaaaaaaaaaaaa;
            QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
            ProStringList::toQStringList((ProStringList *)in_stack_ffffffffffffeb50);
            QList<QString>::begin((QList<QString> *)in_stack_ffffffffffffeb30);
            QList<QString>::end((QList<QString> *)in_stack_ffffffffffffeb30);
            QSet<QString>::QSet<QList<QString>::const_iterator,_true>
                      ((QSet<QString> *)in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb68,
                       in_stack_ffffffffffffeb60);
            QSet<QString>::operator=
                      ((QSet<QString> *)in_stack_ffffffffffffeb30,
                       (QSet<QString> *)in_stack_ffffffffffffeb28);
            QSet<QString>::~QSet((QSet<QString> *)0x19dae8);
            QList<QString>::~QList((QList<QString> *)0x19daf5);
          }
          else {
            local_127c = 0;
            while( true ) {
              in_stack_ffffffffffffeb88 = (MakefileGenerator *)(long)local_127c;
              qVar5 = QList<MakefileGenerator::SubTarget_*>::size(in_RDX);
              if (qVar5 <= (long)in_stack_ffffffffffffeb88) break;
              QList<MakefileGenerator::SubTarget_*>::at
                        ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                         (qsizetype)in_stack_ffffffffffffeb28);
              QSet<QString>::insert
                        ((QSet<QString> *)in_stack_ffffffffffffeb48,
                         &in_stack_ffffffffffffeb40->targetPrefix);
              local_127c = local_127c + 1;
            }
          }
          local_1280 = 0;
          while( true ) {
            pQVar6 = (QTextStream *)(long)local_1280;
            qVar5 = QList<MakefileGenerator::SubTarget_*>::size(in_RDX);
            if (qVar5 <= (long)pQVar6) break;
            ppSVar7 = QList<MakefileGenerator::SubTarget_*>::at
                                ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                                 (qsizetype)in_stack_ffffffffffffeb28);
            pSVar1 = *ppSVar7;
            local_cb0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_cb0[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_cb0[0].d.size = -0x5555555555555556;
            QString::QString((QString *)in_stack_ffffffffffffeb30,
                             &in_stack_ffffffffffffeb28->targetPrefix);
            bVar2 = QString::isEmpty((QString *)0x19dc14);
            if ((!bVar2) &&
               (uVar8 = QString::endsWith((QString *)local_cb0,0x3bdbd8), (uVar8 & 1) == 0)) {
              QString::operator+=((QString *)in_stack_ffffffffffffeb30,
                                  &in_stack_ffffffffffffeb28->targetPrefix);
            }
            local_cc8 = 0xaaaaaaaaaaaaaaaa;
            local_cc0 = 0xaaaaaaaaaaaaaaaa;
            local_cb8 = 0xaaaaaaaaaaaaaaaa;
            QString::QString((QString *)in_stack_ffffffffffffeb30,
                             &in_stack_ffffffffffffeb28->targetPrefix);
            bVar2 = QString::isEmpty((QString *)0x19dc9c);
            if ((!bVar2) &&
               (uVar8 = QString::endsWith((QString *)&local_cc8,0x3bdbd8), (uVar8 & 1) == 0)) {
              QString::operator+=((QString *)in_stack_ffffffffffffeb30,
                                  &in_stack_ffffffffffffeb28->targetPrefix);
            }
            bVar2 = QString::isEmpty((QString *)0x19dcde);
            if ((!bVar2) &&
               (uVar8 = QString::startsWith((QString *)&local_cc8,(CaseSensitivity)&local_80),
               (uVar8 & 1) != 0)) {
              QString::size(&local_80);
              QString::mid((longlong)&local_d30.commands,(longlong)&local_cc8);
              ::operator+((QString *)in_stack_ffffffffffffeb38,(QString *)in_stack_ffffffffffffeb30)
              ;
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QString_&,_QString> *)in_stack_ffffffffffffeb28);
              QString::operator=((QString *)in_stack_ffffffffffffeb30,
                                 &in_stack_ffffffffffffeb28->targetPrefix);
              QString::~QString((QString *)0x19dd88);
              QStringBuilder<QString_&,_QString>::~QStringBuilder
                        ((QStringBuilder<QString_&,_QString> *)0x19dd95);
              QString::~QString((QString *)0x19dda2);
            }
            bVar2 = QSet<QString>::contains
                              ((QSet<QString> *)in_stack_ffffffffffffeb30,
                               &in_stack_ffffffffffffeb28->targetPrefix);
            if (bVar2) {
              local_d30.targetPrefix.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_d30.targetPrefix.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_d30.targetPrefix.d.size = -0x5555555555555556;
              bVar2 = QString::isEmpty((QString *)0x19de05);
              if (bVar2) {
                QString::QString((QString *)in_stack_ffffffffffffeb38,
                                 (char *)in_stack_ffffffffffffeb68.i);
              }
              else {
                (**(code **)(*in_RDI + 0x60))(local_d90,in_RDI,&local_cc8);
                ::operator+((char (*) [6])in_stack_ffffffffffffeb38,
                            (QString *)in_stack_ffffffffffffeb30);
                ::operator+((QStringBuilder<const_char_(&)[6],_QString> *)in_stack_ffffffffffffeb38,
                            (char (*) [5])in_stack_ffffffffffffeb30);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                            *)in_stack_ffffffffffffeb28);
                QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::
                ~QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>
                                 *)0x19ded8);
                QStringBuilder<const_char_(&)[6],_QString>::~QStringBuilder
                          ((QStringBuilder<const_char_(&)[6],_QString> *)0x19def1);
                QString::~QString((QString *)0x19df0a);
              }
              local_da8 = 0xaaaaaaaaaaaaaaaa;
              local_da0 = 0xaaaaaaaaaaaaaaaa;
              local_d98 = 0xaaaaaaaaaaaaaaaa;
              (**(code **)(*in_RDI + 0x60))(local_de0,in_RDI,&pSVar1->makefile);
              ::operator+((char (*) [5])in_stack_ffffffffffffeb38,
                          (QString *)in_stack_ffffffffffffeb30);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<const_char_(&)[5],_QString> *)in_stack_ffffffffffffeb28);
              QStringBuilder<const_char_(&)[5],_QString>::~QStringBuilder
                        ((QStringBuilder<const_char_(&)[5],_QString> *)0x19df97);
              QString::~QString((QString *)0x19dfa4);
              local_df8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_df8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_df8.d.size = -0x5555555555555556;
              QString::QString((QString *)0x19dfde);
              local_e10 = (QMakeHandler *)0xaaaaaaaaaaaaaaaa;
              local_e08 = (QMakeVfs *)0xaaaaaaaaaaaaaaaa;
              local_e00 = (Data *)0xaaaaaaaaaaaaaaaa;
              QString::QString((QString *)0x19e018);
              bVar2 = QString::isEmpty((QString *)0x19e029);
              if (!bVar2) {
                QString::operator=(&local_df8,(QString *)&pSVar1->makefile);
                local_e68 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                        &in_stack_ffffffffffffeb28->targetPrefix);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QString_&,_QString_&> *)in_stack_ffffffffffffeb28);
                QFlags<MakefileGenerator::FileFixifyType>::QFlags
                          ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffeb30,
                           (FileFixifyType)((ulong)in_stack_ffffffffffffeb28 >> 0x20));
                fileFixify(in_stack_ffffffffffffebe0,(QString *)in_stack_ffffffffffffebd8,
                           (FileFixifyTypes)in_stack_fffffffffffff08c.i,
                           SUB81((ulong)in_stack_ffffffffffffebd0 >> 0x38,0));
                (**(code **)(*in_RDI + 0x60))(local_e28,in_RDI,local_e40);
                QString::operator=((QString *)in_stack_ffffffffffffeb30,
                                   &in_stack_ffffffffffffeb28->targetPrefix);
                QString::~QString((QString *)0x19e104);
                QString::~QString((QString *)0x19e111);
                QString::~QString((QString *)0x19e11e);
                uVar8 = QString::startsWith((QString *)&local_df8,(CaseSensitivity)local_cb0);
                if ((uVar8 & 1) != 0) {
                  QString::size(local_cb0);
                  QString::mid((longlong)local_e88,(longlong)&local_df8);
                  QString::operator=((QString *)in_stack_ffffffffffffeb30,
                                     &in_stack_ffffffffffffeb28->targetPrefix);
                  QString::~QString((QString *)0x19e18c);
                }
                (**(code **)(*in_RDI + 0x60))(local_ea0,in_RDI,&local_df8);
                QString::operator=((QString *)in_stack_ffffffffffffeb30,
                                   &in_stack_ffffffffffffeb28->targetPrefix);
                QString::~QString((QString *)0x19e1cc);
              }
              if ((in_ECX & 2) == 0) {
                local_f28 = (Data *)0xaaaaaaaaaaaaaaaa;
                local_f20 = (QString *)0xaaaaaaaaaaaaaaaa;
                local_f18 = -0x5555555555555556;
                local_f50 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                        (char (*) [2])in_stack_ffffffffffffeb28);
                QList<ProString>::const_iterator::operator*(local_9f0);
                ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                            in_stack_ffffffffffffeb30,(ProString *)in_stack_ffffffffffffeb28);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>
                            *)in_stack_ffffffffffffeb28);
                pQVar13 = (QTextStream *)
                          QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&local_f28);
                QTextStream::operator<<(pQVar13,":");
                bVar2 = QList<ProString>::isEmpty((QList<ProString> *)0x19e44f);
                if (!bVar2) {
                  in_stack_ffffffffffffeb68.i =
                       (QString *)QTextStream::operator<<((QTextStream *)in_RSI," ");
                  in_stack_ffffffffffffeb60.i = (QString *)&pSVar1->depends;
                  QString::QString((QString *)0x19e490);
                  QList<ProString>::const_iterator::operator*(local_9f0);
                  local_fc0 = ::operator+((char (*) [2])in_stack_ffffffffffffeb30,
                                          (ProString *)in_stack_ffffffffffffeb28);
                  ::operator+((QStringBuilder<const_char_(&)[2],_const_ProString_&> *)
                              in_stack_ffffffffffffeb30,(char (*) [2])in_stack_ffffffffffffeb28);
                  ::QStringBuilder::operator_cast_to_QString
                            ((QStringBuilder<QStringBuilder<const_char_(&)[2],_const_ProString_&>,_const_char_(&)[2]>
                              *)in_stack_ffffffffffffeb28);
                  QList<ProString>::const_iterator::operator*(local_9f0);
                  local_fe8 = ::operator+((char (*) [2])in_stack_ffffffffffffeb30,
                                          (ProString *)in_stack_ffffffffffffeb28);
                  ::QStringBuilder::operator_cast_to_QString
                            ((QStringBuilder<const_char_(&)[2],_const_ProString_&> *)
                             in_stack_ffffffffffffeb28);
                  valGlue((MakefileGenerator *)in_stack_ffffffffffffeb60.i,
                          (ProStringList *)in_stack_ffffffffffffeb58,
                          (QString *)in_stack_ffffffffffffeb50,(QString *)in_stack_ffffffffffffeb48,
                          &in_stack_ffffffffffffeb40->targetPrefix);
                  QTextStream::operator<<
                            ((QTextStream *)in_stack_ffffffffffffeb68.i,(QString *)local_f68);
                  QString::~QString((QString *)0x19e57f);
                  QString::~QString((QString *)0x19e58c);
                  QString::~QString((QString *)0x19e599);
                  QString::~QString((QString *)0x19e5a6);
                }
                local_ff8 = ::operator+((char (*) [2])in_stack_ffffffffffffeb30,
                                        &in_stack_ffffffffffffeb28->targetPrefix);
                ::operator+=(in_stack_ffffffffffffeb60.i,
                             (QStringBuilder<const_char_(&)[2],_const_QString_&> *)
                             in_stack_ffffffffffffeb58);
                QString::~QString((QString *)0x19e5ec);
              }
              else {
                local_eb8 = -0x5555555555555556;
                local_eb0 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
                local_ea8 = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
                local_f00 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                        (char (*) [2])in_stack_ffffffffffffeb28);
                QList<ProString>::const_iterator::operator*(local_9f0);
                ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)
                            in_stack_ffffffffffffeb30,(ProString *)in_stack_ffffffffffffeb28);
                ::operator+((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>
                             *)in_stack_ffffffffffffeb30,(char (*) [9])in_stack_ffffffffffffeb28);
                ::QStringBuilder::operator_cast_to_QString
                          ((QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_const_ProString_&>,_const_char_(&)[9]>
                            *)in_stack_ffffffffffffeb28);
                pQVar13 = (QTextStream *)
                          QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&local_eb8);
                QTextStream::operator<<(pQVar13,":");
                if (local_1280 != 0) {
                  in_stack_ffffffffffffeb70 =
                       (MakefileGenerator *)QTextStream::operator<<((QTextStream *)in_RSI," ");
                  ppSVar7 = QList<MakefileGenerator::SubTarget_*>::at
                                      ((QList<MakefileGenerator::SubTarget_*> *)
                                       in_stack_ffffffffffffeb30,
                                       (qsizetype)in_stack_ffffffffffffeb28);
                  pQVar13 = (QTextStream *)
                            QTextStream::operator<<
                                      ((QTextStream *)in_stack_ffffffffffffeb70,
                                       (QString *)&(*ppSVar7)->target);
                  in_stack_ffffffffffffeb78 = (QString *)QTextStream::operator<<(pQVar13,"-");
                  QList<ProString>::const_iterator::operator*(local_9f0);
                  pQVar13 = ::operator<<((QTextStream *)in_stack_ffffffffffffeb60.i,
                                         (ProString *)in_stack_ffffffffffffeb58);
                  QTextStream::operator<<(pQVar13,"_ordered ");
                }
                local_f10 = ::operator+((char (*) [2])in_stack_ffffffffffffeb30,
                                        &in_stack_ffffffffffffeb28->targetPrefix);
                ::operator+=(in_stack_ffffffffffffeb60.i,
                             (QStringBuilder<const_char_(&)[2],_const_QString_&> *)
                             in_stack_ffffffffffffeb58);
                QString::~QString((QString *)0x19e383);
              }
              local_1010 = (char16_t *)0xaaaaaaaaaaaaaaaa;
              local_1008 = -0x5555555555555556;
              local_1000 = (Data *)0xaaaaaaaaaaaaaaaa;
              QString::QString((QString *)in_stack_ffffffffffffeb30,
                               &in_stack_ffffffffffffeb28->targetPrefix);
              memset(local_1040,0xaa,0x30);
              QList<ProString>::const_iterator::operator*(local_9f0);
              local_1050 = ::operator+((ProString *)in_stack_ffffffffffffeb30,
                                       (char (*) [16])in_stack_ffffffffffffeb28);
              ProKey::ProKey<ProString_const&,char_const(&)[16]>
                        ((ProKey *)in_stack_ffffffffffffeb30,
                         (QStringBuilder<const_ProString_&,_const_char_(&)[16]> *)
                         in_stack_ffffffffffffeb28);
              bVar2 = QMakeProject::isSet(in_stack_ffffffffffffeb30,
                                          (ProKey *)in_stack_ffffffffffffeb28);
              if (bVar2) {
                QMakeEvaluator::first(in_stack_ffffffffffffeb48,(ProKey *)in_stack_ffffffffffffeb40)
                ;
                ProString::toQString((ProString *)in_stack_ffffffffffffeb28);
                QString::operator=((QString *)in_stack_ffffffffffffeb30,
                                   &in_stack_ffffffffffffeb28->targetPrefix);
                QString::~QString((QString *)0x19e703);
                ProString::~ProString((ProString *)0x19e710);
              }
              in_stack_ffffffffffffeb58 = in_RSI;
              local_10d8 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                       (char (*) [2])in_stack_ffffffffffffeb28);
              ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffeb30,
                          &in_stack_ffffffffffffeb28->targetPrefix);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                         in_stack_ffffffffffffeb28);
              in_stack_ffffffffffffeb28 = &local_d30;
              in_stack_ffffffffffffeb30 = (QMakeProject *)&stack0xffffffffffffef50;
              writeSubTargetCall(in_stack_ffffffffffffeb88,pQVar6,in_stack_ffffffffffffeb78,
                                 (QString *)in_stack_ffffffffffffeb70,in_stack_ffffffffffffeb68.i,
                                 in_stack_ffffffffffffeb60.i,
                                 (QString *)CONCAT44(in_stack_ffffffffffffee04,uVar15),
                                 &(o.i)->m_string);
              QString::~QString((QString *)0x19e7cb);
              ProKey::~ProKey((ProKey *)0x19e7d8);
              QString::~QString((QString *)0x19e7e5);
              QString::~QString((QString *)0x19e7f2);
              QString::~QString((QString *)0x19e7ff);
              QString::~QString((QString *)0x19e80c);
              QString::~QString((QString *)0x19e819);
            }
            QString::~QString((QString *)0x19e831);
            QString::~QString((QString *)0x19e83e);
            local_1280 = local_1280 + 1;
          }
          ProKey::~ProKey((ProKey *)0x19e872);
          QSet<QString>::~QSet((QSet<QString> *)0x19e87f);
        }
        qVar5 = QListSpecialMethodsBase<ProString>::indexOf<char[6]>
                          ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffeb30,
                           (char (*) [6])in_stack_ffffffffffffeb28,0x19e897);
        if (qVar5 != -1) {
          QString::operator+=((QString *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb48
                             );
        }
        in_stack_ffffffffffffeb50 = in_RSI;
        Option::fixPathToTargetOS
                  ((QString *)in_stack_ffffffffffffeb48,
                   SUB81((ulong)in_stack_ffffffffffffeb40 >> 0x38,0),
                   SUB81((ulong)in_stack_ffffffffffffeb40 >> 0x30,0));
        (**(code **)(*in_RDI + 0x68))(local_10f0,in_RDI,local_1108);
        pQVar6 = (QTextStream *)
                 QTextStream::operator<<
                           ((QTextStream *)in_stack_ffffffffffffeb50,(QString *)local_10f0);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,":");
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&local_af8);
        QTextStream::operator<<(pQVar6,"\n");
        QString::~QString((QString *)0x19e945);
        QString::~QString((QString *)0x19e952);
        bVar2 = QString::isEmpty((QString *)0x19e95f);
        if (!bVar2) {
          pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,"\t");
          QTextStream::operator<<(pQVar6,(QString *)&local_aa0);
          ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                       (QTextStreamFunction)in_stack_ffffffffffffeb28);
        }
        QString::~QString((QString *)0x19e9a3);
        QString::~QString((QString *)0x19e9b0);
        QString::~QString((QString *)0x19e9bd);
        QList<ProString>::const_iterator::operator++(local_9f0);
      }
      if ((in_ECX & 1) != 0) {
        ProString::ProString
                  ((ProString *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb48);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
        QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffffeb30,
                   (rvalue_ref)in_stack_ffffffffffffeb28);
        ProKey::~ProKey((ProKey *)0x19ea4d);
        ProString::~ProString((ProString *)0x19ea5a);
        ProString::ProString
                  ((ProString *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb48);
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
        QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
        QList<ProString>::operator+=
                  ((QList<ProString> *)in_stack_ffffffffffffeb30,
                   (rvalue_ref)in_stack_ffffffffffffeb28);
        ProKey::~ProKey((ProKey *)0x19eac5);
        ProString::~ProString((ProString *)0x19ead2);
        writeInstalls(in_stack_ffffffffffffed10,in_stack_ffffffffffffed08,(bool)noBuild);
      }
      QTextStream::operator<<((QTextStream *)in_RSI,"FORCE:\n\n");
      (**(code **)(*in_RDI + 0x38))(in_RDI,in_RSI);
      std::unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_>::
      ~unique_ptr((unique_ptr<SequentialInstallData,_std::default_delete<SequentialInstallData>_> *)
                  in_stack_ffffffffffffeb30);
      QString::~QString((QString *)0x19eb33);
      QList<QString>::~QList((QList<QString> *)0x19eb40);
      if (*(QMakeParser **)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return;
    }
    local_690 = 0xaaaaaaaaaaaaaaaa;
    local_688 = 0xaaaaaaaaaaaaaaaa;
    local_680 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::at((QList<QString> *)in_stack_ffffffffffffeb30,
                       (qsizetype)in_stack_ffffffffffffeb28);
    QString::QString((QString *)in_stack_ffffffffffffeb30,&in_stack_ffffffffffffeb28->targetPrefix);
    local_13e1 = 0;
    if ((in_ECX & 1) == 0) {
      QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
      local_13e1 = QString::endsWith((QString *)&local_690,(CaseSensitivity)local_6a8);
      QString::~QString((QString *)0x19ca90);
    }
    if ((local_13e1 & 1) == 0) {
      pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&local_690);
      QTextStream::operator<<(pQVar6,":");
      for (local_1230 = 0; qVar5 = QList<MakefileGenerator::SubTarget_*>::size(in_RDX),
          local_1230 < qVar5; local_1230 = local_1230 + 1) {
        QList<MakefileGenerator::SubTarget_*>::at
                  ((QList<MakefileGenerator::SubTarget_*> *)in_stack_ffffffffffffeb30,
                   (qsizetype)in_stack_ffffffffffffeb28);
        local_6e8 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                (char (*) [8])in_stack_ffffffffffffeb28);
        ProKey::ProKey<QString&,char_const(&)[8]>
                  ((ProKey *)in_stack_ffffffffffffeb30,
                   (QStringBuilder<QString_&,_const_char_(&)[8]> *)in_stack_ffffffffffffeb28);
        QMakeProject::values(in_stack_ffffffffffffeb30,(ProKey *)in_stack_ffffffffffffeb28);
        ProKey::~ProKey((ProKey *)0x19cbbc);
        local_6f0 = "make_first";
        bVar3 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28
                            );
        bVar2 = false;
        if (bVar3) {
          qVar5 = QListSpecialMethodsBase<ProString>::indexOf<char[18]>
                            ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffeb30,
                             (char (*) [18])in_stack_ffffffffffffeb28,0x19cc1a);
          bVar2 = qVar5 != -1;
        }
        if (!bVar2) {
          local_6f8 = "install_subtargets";
          bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,
                               (char **)in_stack_ffffffffffffeb28);
          if (bVar2) {
LAB_0019cc98:
            qVar5 = QListSpecialMethodsBase<ProString>::indexOf<char[19]>
                              ((QListSpecialMethodsBase<ProString> *)in_stack_ffffffffffffeb30,
                               (char (*) [19])in_stack_ffffffffffffeb28,0x19ccb0);
            bVar2 = qVar5 != -1;
          }
          else {
            local_700 = "uninstall_subtargets";
            bVar3 = ::operator==((QString *)in_stack_ffffffffffffeb30,
                                 (char **)in_stack_ffffffffffffeb28);
            bVar2 = false;
            if (bVar3) goto LAB_0019cc98;
          }
          if (!bVar2) {
            local_718 = 0xaaaaaaaaaaaaaaaa;
            local_710 = 0xaaaaaaaaaaaaaaaa;
            local_708 = 0xaaaaaaaaaaaaaaaa;
            local_740 = ::operator+((QString *)in_stack_ffffffffffffeb30,
                                    (char (*) [2])in_stack_ffffffffffffeb28);
            ::operator+((QStringBuilder<QString_&,_const_char_(&)[2]> *)in_stack_ffffffffffffeb30,
                        &in_stack_ffffffffffffeb28->targetPrefix);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&> *)
                       in_stack_ffffffffffffeb28);
            if ((in_ECX & 2) != 0) {
              QString::operator+=((QString *)in_stack_ffffffffffffeb30,
                                  (char *)in_stack_ffffffffffffeb48);
            }
            pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
            QTextStream::operator<<(pQVar6,(QString *)&local_718);
            QString::~QString((QString *)0x19cdab);
          }
        }
      }
      local_748 = "all";
      bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28);
      local_140a = true;
      if (!bVar2) {
        local_750 = "make_first";
        local_140a = ::operator==((QString *)in_stack_ffffffffffffeb30,
                                  (char **)in_stack_ffffffffffffeb28);
      }
      if (local_140a != false) {
        pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,' ');
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
        depVar((MakefileGenerator *)in_stack_ffffffffffffeb48,(ProKey *)in_stack_ffffffffffffeb40);
        QTextStream::operator<<(pQVar6,(QString *)local_768);
        QString::~QString((QString *)0x19ce9a);
        ProKey::~ProKey((ProKey *)0x19cea7);
      }
      local_7a0 = "clean";
      bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28);
      if (bVar2) {
        in_stack_ffffffffffffebe0 =
             (MakefileGenerator *)QTextStream::operator<<((QTextStream *)in_RSI,' ');
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
        depVar((MakefileGenerator *)in_stack_ffffffffffffeb48,(ProKey *)in_stack_ffffffffffffeb40);
        QTextStream::operator<<((QTextStream *)in_stack_ffffffffffffebe0,(QString *)local_7b8);
        QString::~QString((QString *)0x19cf3e);
        ProKey::~ProKey((ProKey *)0x19cf4b);
      }
      else {
        local_7f0 = "distclean";
        bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28
                            );
        if (bVar2) {
          in_stack_ffffffffffffebd8 =
               (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,' ');
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
          depVar((MakefileGenerator *)in_stack_ffffffffffffeb48,(ProKey *)in_stack_ffffffffffffeb40)
          ;
          QTextStream::operator<<(in_stack_ffffffffffffebd8,(QString *)local_808);
          QString::~QString((QString *)0x19cfe7);
          ProKey::~ProKey((ProKey *)0x19cff4);
        }
      }
      QTextStream::operator<<((QTextStream *)in_RSI," FORCE\n");
      local_840 = "clean";
      bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28);
      if (bVar2) {
        in_stack_ffffffffffffebd0 = in_RSI;
        ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
        QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
        QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
        QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i);
        fixFileVarGlue(in_stack_ffffffffffffeb70,(ProKey *)in_stack_ffffffffffffeb68.i,
                       in_stack_ffffffffffffeb60.i,(QString *)in_stack_ffffffffffffeb58,
                       (QString *)in_stack_ffffffffffffeb50);
        QTextStream::operator<<((QTextStream *)in_stack_ffffffffffffebd0,(QString *)local_858);
        QString::~QString((QString *)0x19d0ee);
        QString::~QString((QString *)0x19d0fb);
        QString::~QString((QString *)0x19d108);
        QString::~QString((QString *)0x19d115);
        ProKey::~ProKey((ProKey *)0x19d122);
      }
      else {
        local_8d8 = "distclean";
        bVar2 = ::operator==((QString *)in_stack_ffffffffffffeb30,(char **)in_stack_ffffffffffffeb28
                            );
        if (bVar2) {
          local_8f0 = 0xaaaaaaaaaaaaaaaa;
          local_8e8 = 0xaaaaaaaaaaaaaaaa;
          local_8e0 = 0xaaaaaaaaaaaaaaaa;
          QFile::fileName();
          QFlags<MakefileGenerator::FileFixifyType>::QFlags
                    ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_ffffffffffffeb30,
                     (FileFixifyType)((ulong)in_stack_ffffffffffffeb28 >> 0x20));
          fileFixify(in_stack_ffffffffffffebe0,(QString *)in_stack_ffffffffffffebd8,
                     (FileFixifyTypes)in_stack_fffffffffffff08c.i,
                     SUB81((ulong)in_stack_ffffffffffffebd0 >> 0x38,0));
          QString::~QString((QString *)0x19d1db);
          bVar2 = QString::isEmpty((QString *)0x19d1e8);
          if (!bVar2) {
            pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI,"\t-$(DEL_FILE) ")
            ;
            (**(code **)(*in_RDI + 0x60))(local_928,in_RDI,&local_8f0);
            QTextStream::operator<<(pQVar6,(QString *)local_928);
            ::operator<<((QTextStream *)in_stack_ffffffffffffeb30,
                         (QTextStreamFunction)in_stack_ffffffffffffeb28);
            QString::~QString((QString *)0x19d257);
          }
          ProKey::ProKey((ProKey *)in_stack_ffffffffffffeb30,(char *)in_stack_ffffffffffffeb28);
          QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i)
          ;
          QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i)
          ;
          QString::QString((QString *)in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb68.i)
          ;
          fixFileVarGlue(in_stack_ffffffffffffeb70,(ProKey *)in_stack_ffffffffffffeb68.i,
                         in_stack_ffffffffffffeb60.i,(QString *)in_stack_ffffffffffffeb58,
                         (QString *)in_stack_ffffffffffffeb50);
          QTextStream::operator<<((QTextStream *)in_RSI,(QString *)local_940);
          QString::~QString((QString *)0x19d30e);
          QString::~QString((QString *)0x19d31b);
          QString::~QString((QString *)0x19d328);
          QString::~QString((QString *)0x19d335);
          ProKey::~ProKey((ProKey *)0x19d342);
          QString::~QString((QString *)0x19d34f);
        }
      }
    }
    QString::~QString((QString *)0x19d369);
    local_1224 = local_1224 + 1;
  } while( true );
}

Assistant:

void
MakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    // blasted includes
    const ProStringList &qeui = project->values("QMAKE_EXTRA_INCLUDES");
    for (ProStringList::ConstIterator qeui_it = qeui.begin(); qeui_it != qeui.end(); ++qeui_it)
        t << "include " << (*qeui_it) << Qt::endl;

    if (!(flags & SubTargetSkipDefaultVariables)) {
        writeDefaultVariables(t);
        t << "SUBTARGETS    = ";     // subtargets are sub-directory
        for(int target = 0; target < targets.size(); ++target)
            t << " \\\n\t\t" << targets.at(target)->target;
        t << Qt::endl << Qt::endl;
    }
    writeExtraVariables(t);

    QStringList targetSuffixes;
    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    if (!(flags & SubTargetSkipDefaultTargets)) {
        targetSuffixes << "make_first" << "all" << "clean" << "distclean"
                       << QString((flags & SubTargetInstalls) ? "install_subtargets" : "install")
                       << QString((flags & SubTargetInstalls) ? "uninstall_subtargets" : "uninstall");
    }

    struct SequentialInstallData
    {
        QString targetPrefix;
        QString commands;
        QTextStream commandsStream;
        SequentialInstallData() : commandsStream(&commands) {}
    };
    std::unique_ptr<SequentialInstallData> sequentialInstallData;
    bool dont_recurse = project->isActiveConfig("dont_recurse");

    // generate target rules
    for(int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

        //qmake it
        QString out;
        QString in;
        if(!subtarget->profile.isEmpty()) {
            out = subtarget->makefile;
            in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
            if(out.startsWith(in_directory))
                out = out.mid(in_directory.size());
            out = escapeFilePath(out);
            t << subtarget->target << "-qmake_all: ";
            if (flags & SubTargetOrdered) {
                if (target)
                    t << targets.at(target - 1)->target << "-qmake_all";
            } else {
                if (!subtarget->depends.isEmpty())
                    t << valGlue(subtarget->depends, QString(), "-qmake_all ", "-qmake_all");
            }
            t << " FORCE\n\t";
            if(!in_directory.isEmpty()) {
                t << mkdir_p_asstring(out_directory)
                  << out_directory_cdin;
            }
            t << "$(QMAKE) -o " << out << ' ' << in << buildArgs(false);
            if (!dont_recurse)
                writeSubMakeCall(t, out_directory_cdin, makefilein + " qmake_all");
            else
                t << Qt::endl;
        }

        { //actually compile
            t << subtarget->target << ":";
            auto extraDeps = extraSubTargetDependencies();
            if (!extraDeps.isEmpty())
                t << " " << valList(extraDeps);
            if(!subtarget->depends.isEmpty())
                t << " " << valList(subtarget->depends);
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein);
        }

        for(int suffix = 0; suffix < targetSuffixes.size(); ++suffix) {
            QString s = targetSuffixes.at(suffix);
            if(s == "install_subtargets")
                s = "install";
            else if(s == "uninstall_subtargets")
                s = "uninstall";
            else if(s == "make_first")
                s = QString();

            if (project->isActiveConfig("build_all") && s == "install") {
                if (!sequentialInstallData)
                    sequentialInstallData.reset(new SequentialInstallData);
                sequentialInstallData->targetPrefix += subtarget->target + '-';
                writeSubTargetCall(sequentialInstallData->commandsStream, in_directory, in,
                                   out_directory, out, out_directory_cdin,
                                   makefilein + " " + s);
                chopEndLines(&sequentialInstallData->commands);
            }

            if(flags & SubTargetOrdered) {
                t << subtarget->target << "-" << targetSuffixes.at(suffix) << "-ordered:";
                if(target)
                    t << " " << targets.at(target-1)->target << "-" << targetSuffixes.at(suffix) << "-ordered ";
                t << " FORCE";
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + s);
            }
            t << subtarget->target << "-" << targetSuffixes.at(suffix) << ":";
            if(!subtarget->depends.isEmpty())
                t << " " << valGlue(subtarget->depends, QString(), "-" + targetSuffixes.at(suffix) + " ",
                                    "-"+targetSuffixes.at(suffix));
            t << " FORCE";
            writeSubTargetCall(t, in_directory, in, out_directory, out,
                               out_directory_cdin, makefilein + " " + s);
        }
    }
    t << Qt::endl;

    if (sequentialInstallData) {
        t << sequentialInstallData->targetPrefix << "install: FORCE"
          << sequentialInstallData->commands << Qt::endl << Qt::endl;
    }

    if (!(flags & SubTargetSkipDefaultTargets)) {
        writeMakeQmake(t, true);

        t << "qmake_all:";
        if(!targets.isEmpty()) {
            for(QList<SubTarget*>::Iterator it = targets.begin(); it != targets.end(); ++it) {
                if(!(*it)->profile.isEmpty())
                    t << " " << (*it)->target << "-qmake_all";
            }
        }
        t << " FORCE\n\n";
    }

    for(int s = 0; s < targetSuffixes.size(); ++s) {
        QString suffix = targetSuffixes.at(s);
        if(!(flags & SubTargetInstalls) && suffix.endsWith("install"))
            continue;

        t << suffix << ":";
        for(int target = 0; target < targets.size(); ++target) {
            SubTarget *subTarget = targets.at(target);
            const ProStringList &config = project->values(ProKey(subTarget->name + ".CONFIG"));
            if (suffix == "make_first"
                && config.indexOf("no_default_target") != -1) {
                continue;
            }
            if((suffix == "install_subtargets" || suffix == "uninstall_subtargets")
                && config.indexOf("no_default_install") != -1) {
                continue;
            }
            QString targetRule = subTarget->target + "-" + suffix;
            if(flags & SubTargetOrdered)
                targetRule += "-ordered";
            t << " " << targetRule;
        }
        if(suffix == "all" || suffix == "make_first")
            t << ' ' << depVar("ALL_DEPS");
        if(suffix == "clean")
            t << ' ' << depVar("CLEAN_DEPS");
        else if (suffix == "distclean")
            t << ' ' << depVar("DISTCLEAN_DEPS");
        t << " FORCE\n";
        if(suffix == "clean") {
            t << fixFileVarGlue("QMAKE_CLEAN", "\t-$(DEL_FILE) ", "\n\t-$(DEL_FILE) ", "\n");
        } else if(suffix == "distclean") {
            QString ofile = fileFixify(Option::output.fileName());
            if(!ofile.isEmpty())
                t << "\t-$(DEL_FILE) " << escapeFilePath(ofile) << Qt::endl;
            t << fixFileVarGlue("QMAKE_DISTCLEAN", "\t-$(DEL_FILE) ", " ", "\n");
        }
    }

    // user defined targets
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator qut_it = qut.begin(); qut_it != qut.end(); ++qut_it) {
        const ProStringList &config = project->values(ProKey(*qut_it + ".CONFIG"));
        QString targ = var(ProKey(*qut_it + ".target")),
                 cmd = var(ProKey(*qut_it + ".commands")), deps;
        if(targ.isEmpty())
            targ = (*qut_it).toQString();
        t << Qt::endl;

        const ProStringList &deplist = project->values(ProKey(*qut_it + ".depends"));
        for (ProStringList::ConstIterator dep_it = deplist.begin(); dep_it != deplist.end(); ++dep_it) {
            QString dep = var(ProKey(*dep_it + ".target"));
            if(dep.isEmpty())
                dep = (*dep_it).toQString();
            deps += ' ' + escapeDependencyPath(Option::fixPathToTargetOS(dep, false));
        }
        if (config.indexOf("recursive") != -1) {
            QSet<QString> recurse;
            const ProKey rkey(*qut_it + ".recurse");
            if (project->isSet(rkey)) {
                const QStringList values = project->values(rkey).toQStringList();
                recurse = QSet<QString>(values.begin(), values.end());
            } else {
                for(int target = 0; target < targets.size(); ++target)
                    recurse.insert(targets.at(target)->name);
            }
            for(int target = 0; target < targets.size(); ++target) {
                SubTarget *subtarget = targets.at(target);
                QString in_directory = subtarget->in_directory;
                if(!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
                    in_directory += Option::dir_sep;
                QString out_directory = subtarget->out_directory;
                if(!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
                    out_directory += Option::dir_sep;
                if(!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
                    out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

                if(!recurse.contains(subtarget->name))
                    continue;

                QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                                     : "\n\tcd " + escapeFilePath(out_directory) + " && ";
                QString makefilein = " -f " + escapeFilePath(subtarget->makefile);

                QString out;
                QString in;
                if (!subtarget->profile.isEmpty()) {
                    out = subtarget->makefile;
                    in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
                    if (out.startsWith(in_directory))
                        out = out.mid(in_directory.size());
                    out = escapeFilePath(out);
                }

                //write the rule/depends
                if(flags & SubTargetOrdered) {
                    const QString dep = subtarget->target + "-" + (*qut_it) + "_ordered";
                    t << dep << ":";
                    if(target)
                        t << " " << targets.at(target-1)->target << "-" << (*qut_it) << "_ordered ";
                    deps += " " + dep;
                } else {
                    const QString dep = subtarget->target + "-" + (*qut_it);
                    t << dep << ":";
                    if(!subtarget->depends.isEmpty())
                        t << " " << valGlue(subtarget->depends, QString(), "-" + (*qut_it) + " ", "-" + (*qut_it));
                    deps += " " + dep;
                }

                QString sub_targ = targ;
                const ProKey rtkey(*qut_it + ".recurse_target");
                if (project->isSet(rtkey))
                    sub_targ = project->first(rtkey).toQString();

                //write the commands
                writeSubTargetCall(t, in_directory, in, out_directory, out,
                                   out_directory_cdin, makefilein + " " + sub_targ);
            }
        }
        if (config.indexOf("phony") != -1)
            deps += " FORCE";
        t << escapeDependencyPath(Option::fixPathToTargetOS(targ, false)) << ":" << deps << "\n";
        if(!cmd.isEmpty())
            t << "\t" << cmd << Qt::endl;
    }

    if(flags & SubTargetInstalls) {
        project->values("INSTALLDEPS")   += "install_subtargets";
        project->values("UNINSTALLDEPS") += "uninstall_subtargets";
        writeInstalls(t, true);
    }
    t << "FORCE:\n\n";
    suppressBuiltinRules(t);
}